

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7Dec.c
# Opt level: O0

void Range_Normalize(CPpmd7z_RangeDec *p)

{
  int iVar1;
  byte bVar2;
  long in_RDI;
  
  if (*(uint *)(in_RDI + 0x18) < 0x1000000) {
    iVar1 = *(int *)(in_RDI + 0x1c);
    bVar2 = (*(code *)**(undefined8 **)(in_RDI + 0x20))(*(undefined8 *)(in_RDI + 0x20));
    *(uint *)(in_RDI + 0x1c) = iVar1 << 8 | (uint)bVar2;
    *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) << 8;
    if (*(uint *)(in_RDI + 0x18) < 0x1000000) {
      iVar1 = *(int *)(in_RDI + 0x1c);
      bVar2 = (*(code *)**(undefined8 **)(in_RDI + 0x20))(*(undefined8 *)(in_RDI + 0x20));
      *(uint *)(in_RDI + 0x1c) = iVar1 << 8 | (uint)bVar2;
      *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) << 8;
    }
  }
  return;
}

Assistant:

static void Range_Normalize(CPpmd7z_RangeDec *p)
{
  if (p->Range < kTopValue)
  {
    p->Code = (p->Code << 8) | p->Stream->Read((void *)p->Stream);
    p->Range <<= 8;
    if (p->Range < kTopValue)
    {
      p->Code = (p->Code << 8) | p->Stream->Read((void *)p->Stream);
      p->Range <<= 8;
    }
  }
}